

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void WindowSettingsHandler_ClearAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  ImGuiWindow **ppIVar1;
  long in_RDI;
  int i;
  ImGuiContext *g;
  int local_1c;
  
  for (local_1c = 0; local_1c != *(int *)(in_RDI + 0x3e48); local_1c = local_1c + 1) {
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[]
                        ((ImVector<ImGuiWindow_*> *)(in_RDI + 0x3e48),local_1c);
    (*ppIVar1)->SettingsOffset = -1;
  }
  ImChunkStream<ImGuiWindowSettings>::clear((ImChunkStream<ImGuiWindowSettings> *)0x123261);
  return;
}

Assistant:

static void WindowSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Windows.Size; i++)
        g.Windows[i]->SettingsOffset = -1;
    g.SettingsWindows.clear();
}